

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line_test.cpp
# Opt level: O2

void __thiscall license::test::issue_license_help::test_method(issue_license_help *this)

{
  long lVar1;
  string stdout_str;
  undefined1 local_260 [8];
  undefined8 local_258;
  shared_count sStack_250;
  char *argv1 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined **local_1c0;
  undefined1 local_1b8;
  undefined1 *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  output_test_stream output;
  streambuf local_198 [376];
  
  argv1[2] = "issue";
  argv1[3] = "-h";
  argv1[0]._0_4_ = 0x4781d7;
  argv1[0]._4_4_ = 0;
  argv1[1]._0_4_ = 0x478db4;
  argv1[1]._4_4_ = 0;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream(&output,&local_1d0,1);
  cout_redirect::cout_redirect((cout_redirect *)&stdout_str,local_198);
  CommandLineParser::parseCommandLine(4,argv1);
  cout_redirect::~cout_redirect((cout_redirect *)&stdout_str);
  std::__cxx11::stringbuf::str();
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/command-line_test.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x89);
  lVar1 = std::__cxx11::string::find((char *)&stdout_str,0x4782c6);
  local_260[0] = lVar1 != -1;
  local_258 = 0;
  sStack_250.pi_ = (sp_counted_base *)0x0;
  std::operator+(&local_220,"command help was print out ",&stdout_str);
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_005be540;
  local_1b0 = boost::unit_test::lazy_ostream::inst;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/command-line_test.cpp"
  ;
  local_1f8 = "";
  local_1a8 = &local_220;
  boost::test_tools::tt_detail::report_assertion(local_260,&local_1c0,&local_200,0x89,1,1,0);
  std::__cxx11::string::~string((string *)&local_220);
  boost::detail::shared_count::~shared_count(&sStack_250);
  std::__cxx11::string::~string((string *)&stdout_str);
  boost::test_tools::output_test_stream::~output_test_stream(&output);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(issue_license_help) {
	int argc = 4;
	const char* argv1[] = {"lcc", "license", "issue", "-h"};
	// initialize_project
	boost::test_tools::output_test_stream output;
	{
		cout_redirect guard(output.rdbuf());
		int result = CommandLineParser::parseCommandLine(argc, argv1);
	}
	string stdout_str = output.str();
	BOOST_CHECK_MESSAGE(stdout_str.find(PARAM_CLIENT_SIGNATURE) != string::npos,
						"command help was print out " + stdout_str);
}